

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O2

int IDASStolerances(void *ida_mem,sunrealtype reltol,sunrealtype abstol)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x29d;
  }
  else if (*(int *)((long)ida_mem + 0x3d0) == 0) {
    msgfmt = "Attempt to call before IDAMalloc.";
    error_code = -0x17;
    line = 0x2a4;
  }
  else if (0.0 <= reltol) {
    if (0.0 <= abstol) {
      *(sunrealtype *)((long)ida_mem + 0x28) = reltol;
      *(sunrealtype *)((long)ida_mem + 0x30) = abstol;
      *(uint *)((long)ida_mem + 0x40) = -(uint)(abstol == 0.0) & 1;
      *(undefined4 *)((long)ida_mem + 0x20) = 1;
      *(undefined4 *)((long)ida_mem + 0x44) = 0;
      *(code **)((long)ida_mem + 0x48) = IDAEwtSet;
      *(undefined8 *)((long)ida_mem + 0x50) = 0;
      return 0;
    }
    msgfmt = "Some atol component < 0.0 illegal.";
    error_code = -0x16;
    line = 0x2b4;
  }
  else {
    msgfmt = "rtol < 0 illegal.";
    error_code = -0x16;
    line = 0x2ad;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDASStolerances",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASStolerances(void* ida_mem, sunrealtype reltol, sunrealtype abstol)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    return (IDA_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RTOL);
    return (IDA_ILL_INPUT);
  }

  if (abstol < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ATOL);
    return (IDA_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  IDA_mem->ida_rtol     = reltol;
  IDA_mem->ida_Satol    = abstol;
  IDA_mem->ida_atolmin0 = (abstol == ZERO);

  IDA_mem->ida_itol = IDA_SS;

  IDA_mem->ida_user_efun = SUNFALSE;
  IDA_mem->ida_efun      = IDAEwtSet;
  IDA_mem->ida_edata     = NULL; /* will be set to ida_mem in InitialSetup */

  return (IDA_SUCCESS);
}